

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O3

void __thiscall SocketManager::SMMLF::exit_all(SMMLF *this)

{
  uint uVar1;
  ulong uVar2;
  
  close(this->serv_sock);
  uVar2 = 0;
  uVar1 = node_type;
  do {
    if (uVar2 != uVar1) {
      close(this->clnt_sock[uVar2]);
      uVar1 = node_type;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 3);
  return;
}

Assistant:

void SocketManager::SMMLF::exit_all() {
    server_exit();
    client_exit();
}